

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreFactory.cpp
# Opt level: O0

void helics::CoreFactory::displayHelp(CoreType type)

{
  string_view name;
  string_view name_00;
  string_view name_01;
  element_type *peVar1;
  int in_EDI;
  shared_ptr<helics::Core> core_1;
  shared_ptr<helics::Core> core;
  shared_ptr<helics::Core> *in_stack_ffffffffffffff38;
  CoreType in_stack_ffffffffffffff7c;
  undefined8 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  shared_ptr<helics::Core> local_58 [2];
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  
  if ((in_EDI == 0) || (in_EDI == 0x16)) {
    std::operator<<((ostream *)&std::cout,"All core types have similar options\n");
    local_28 = 0;
    uStack_20 = 0;
    name._M_str._0_4_ = in_stack_ffffffffffffff88;
    name._M_len = in_stack_ffffffffffffff80;
    name._M_str._4_4_ = in_stack_ffffffffffffff8c;
    makeCore(in_stack_ffffffffffffff7c,name);
    peVar1 = std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x430052);
    local_38 = 6;
    uStack_34 = 0;
    uStack_30 = 0x71b09f;
    uStack_2c = 0;
    (*peVar1->_vptr_Core[2])(peVar1,6,"--help");
    name_00._M_str._0_4_ = in_stack_ffffffffffffff88;
    name_00._M_len = in_stack_ffffffffffffff80;
    name_00._M_str._4_4_ = in_stack_ffffffffffffff8c;
    makeCore(in_stack_ffffffffffffff7c,name_00);
    std::shared_ptr<helics::Core>::operator=(local_58,in_stack_ffffffffffffff38);
    std::shared_ptr<helics::Core>::~shared_ptr((shared_ptr<helics::Core> *)0x4300c8);
    peVar1 = std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x4300d2);
    (*peVar1->_vptr_Core[2])(peVar1,6,"--help");
    std::shared_ptr<helics::Core>::~shared_ptr((shared_ptr<helics::Core> *)0x430103);
  }
  else {
    name_01._M_str._0_4_ = in_stack_ffffffffffffff88;
    name_01._M_len = in_stack_ffffffffffffff80;
    name_01._M_str._4_4_ = in_stack_ffffffffffffff8c;
    makeCore(in_stack_ffffffffffffff7c,name_01);
    peVar1 = std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x43015e);
    (*peVar1->_vptr_Core[2])(peVar1,6,"--help");
    std::shared_ptr<helics::Core>::~shared_ptr((shared_ptr<helics::Core> *)0x43018c);
  }
  return;
}

Assistant:

void displayHelp(CoreType type)
{
    if (type == CoreType::DEFAULT || type == CoreType::UNRECOGNIZED) {
        std::cout << "All core types have similar options\n";
        auto core = makeCore(CoreType::DEFAULT, gHelicsEmptyString);
        core->configure(helpStr);
#ifdef HELICS_ENABLE_TCP_CORE
        core = makeCore(CoreType::TCP_SS, gHelicsEmptyString);
        core->configure(helpStr);
#endif
    } else {
        auto core = makeCore(type, gHelicsEmptyString);
        core->configure(helpStr);
    }
}